

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

bool __thiscall
ON_Triangle::GetBarycentricCoordinates
          (ON_Triangle *this,ON_3dPoint *P,bool constrainInside,double *s1,double *s2)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  double *y;
  double dVar5;
  ON_Line local_210;
  double local_1e0;
  double t_1;
  ON_3dVector local_1a8;
  double local_190;
  double lensq;
  undefined1 local_180 [4];
  int i_2;
  ON_3dVector local_150;
  double local_138;
  double max;
  double local_128;
  double local_120;
  ON_Line local_108;
  double local_d8;
  double t;
  undefined1 auStack_c8 [4];
  int i_1;
  ON_3dPoint s;
  ON_3dVector W;
  ON_3dVector V;
  ON_3dVector VP;
  double d;
  ON_3dVector V_1;
  double dStack_40;
  int i;
  double Min_norm;
  int i0;
  bool rc;
  double *s2_local;
  double *s1_local;
  bool constrainInside_local;
  ON_3dPoint *P_local;
  ON_Triangle *this_local;
  
  Min_norm._0_4_ = 0;
  dStack_40 = 1.79769313486232e+308;
  for (V_1.z._4_4_ = 0; V_1.z._4_4_ < 3; V_1.z._4_4_ = V_1.z._4_4_ + 1) {
    ON_3dPoint::operator-((ON_3dVector *)&d,P,this->m_V + V_1.z._4_4_);
    dVar5 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&d);
    if (dVar5 < dStack_40) {
      Min_norm._0_4_ = V_1.z._4_4_;
      dStack_40 = dVar5;
    }
  }
  ON_3dPoint::operator-((ON_3dVector *)&V.z,P,this->m_V + Min_norm._0_4_);
  ON_3dPoint::operator-
            ((ON_3dVector *)&W.z,this->m_V + (Min_norm._0_4_ + 1) % 3,this->m_V + Min_norm._0_4_);
  ON_3dPoint::operator-
            ((ON_3dVector *)&s.z,this->m_V + (Min_norm._0_4_ + 2) % 3,this->m_V + Min_norm._0_4_);
  ON_3dPoint::ON_3dPoint((ON_3dPoint *)auStack_c8,0.0,0.0,0.0);
  pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(Min_norm._0_4_ + 1) % 3);
  y = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(Min_norm._0_4_ + 2) % 3);
  iVar3 = ON_DecomposeVector((ON_3dVector *)&V.z,(ON_3dVector *)&W.z,(ON_3dVector *)&s.z,pdVar4,y);
  if (iVar3 == 0) {
    Edge((ON_Line *)local_180,this,0);
    ON_Line::Direction(&local_150,(ON_Line *)local_180);
    dVar5 = ON_3dVector::LengthSquared(&local_150);
    ON_Line::~ON_Line((ON_Line *)local_180);
    Min_norm._0_4_ = 0;
    local_138 = dVar5;
    for (lensq._4_4_ = 1; lensq._4_4_ < 3; lensq._4_4_ = lensq._4_4_ + 1) {
      Edge((ON_Line *)&t_1,this,lensq._4_4_);
      ON_Line::Direction(&local_1a8,(ON_Line *)&t_1);
      dVar5 = ON_3dVector::LengthSquared(&local_1a8);
      ON_Line::~ON_Line((ON_Line *)&t_1);
      if (local_138 < dVar5) {
        Min_norm._0_4_ = lensq._4_4_;
        local_138 = dVar5;
      }
      local_190 = dVar5;
    }
    Edge(&local_210,this,Min_norm._0_4_);
    Min_norm._7_1_ = ON_Line::ClosestPointTo(&local_210,P,&local_1e0);
    ON_Line::~ON_Line(&local_210);
    if (Min_norm._7_1_) {
      dVar5 = 1.0 - local_1e0;
      pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(Min_norm._0_4_ + 1) % 3);
      *pdVar4 = dVar5;
      pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(Min_norm._0_4_ + 2) % 3);
      *pdVar4 = local_1e0;
    }
  }
  else {
    pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(Min_norm._0_4_ + 1) % 3);
    dVar5 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(Min_norm._0_4_ + 2) % 3);
    dVar1 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,Min_norm._0_4_);
    *pdVar4 = (1.0 - dVar5) - dVar1;
    if (constrainInside) {
      for (t._4_4_ = 0; t._4_4_ < 3; t._4_4_ = t._4_4_ + 1) {
        pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,t._4_4_);
        if (*pdVar4 <= 0.0 && *pdVar4 != 0.0) {
          Edge(&local_108,this,t._4_4_);
          bVar2 = ON_Line::ClosestPointTo(&local_108,P,&local_d8);
          ON_Line::~ON_Line(&local_108);
          if (bVar2) {
            ON_3dPoint::ON_3dPoint((ON_3dPoint *)&max,0.0,0.0,0.0);
            _auStack_c8 = max;
            s.x = local_128;
            s.y = local_120;
            if (0.0 <= local_d8) {
              if (local_d8 < 1.0) {
                dVar5 = 1.0 - local_d8;
                pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(t._4_4_ + 1) % 3);
                *pdVar4 = dVar5;
                pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(t._4_4_ + 2) % 3);
                *pdVar4 = local_d8;
              }
              else {
                pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(t._4_4_ + 2) % 3);
                *pdVar4 = 1.0;
              }
            }
            else {
              pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,(t._4_4_ + 1) % 3);
              *pdVar4 = 1.0;
            }
          }
          break;
        }
      }
    }
    Min_norm._7_1_ = true;
  }
  if (s1 != (double *)0x0) {
    pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,1);
    *s1 = *pdVar4;
  }
  if (s2 != (double *)0x0) {
    pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)auStack_c8,2);
    *s2 = *pdVar4;
  }
  return Min_norm._7_1_;
}

Assistant:

bool ON_Triangle::GetBarycentricCoordinates(
  const ON_3dPoint& P,
  bool constrainInside,
  double* s1, double* s2
) const
{
	bool rc = false;
	// Choose  base vertex v[i0] is closest to P
	int i0 = 0;
	double Min_norm = ON_DBL_MAX;
	for (int i = 0; i < 3; i++)
	{
		ON_3dVector V = P - m_V[i];
		double d = V.MaximumCoordinate();
		if (d < Min_norm)
		{
			i0 = i;
			Min_norm = d;
		}
	}

	ON_3dVector VP = P - m_V[i0];
	ON_3dVector V = m_V[(i0 + 1) % 3] - m_V[i0];
	ON_3dVector W = m_V[(i0 + 2) % 3] - m_V[i0];
	ON_3dPoint s(0, 0, 0);		// set to barycentric coordinates of solution

	if (ON_DecomposeVector(VP, V, W, &s[(i0 + 1) % 3], &s[(i0 + 2) % 3]))
	{
		// use decomposition
		s[i0] = 1 - s[(i0 + 1) % 3] - s[(i0 + 2) % 3];

    if (constrainInside)
		  for (int i = 0; i < 3; i++)
			  if (s[i] < 0)
			  {
				  double t;
				  if (Edge(i).ClosestPointTo(P, &t))	
				  {
					  s = ON_3dPoint( 0,0,0 );
					  if (t < 0)
					  {
						  s[(i + 1) % 3] = 1.0;
					  }

					  else if (t >= 1.0)
					  {
						  s[(i + 2) % 3] = 1.0;
					  }
					  else
					  {
						  s[(i + 1) % 3] = 1 - t;
						  s[(i + 2) % 3] = t;
					  }
				  }
				  break;
			  }
		rc = true;
	}
	else
	{
		// decomposition failed:
		// Find closest point to longest edge i0
		double max = Edge(0).Direction().LengthSquared();
    i0 = 0;
		for (int i = 1; i < 3; i++)
		{
			double lensq = Edge(i).Direction().LengthSquared();
			if (max < lensq)
			{
				i0 = i;
				max = lensq;
			}
		}
		double t;
		if (Edge(i0).ClosestPointTo(P, &t))
		{
			s[(i0 + 1) % 3] = (1 - t);
			s[(i0 + 2) % 3] = t;
			rc = true;
		}
	
	}
	if (s1)
		*s1 = s[1];
	if (s2)
		*s2 = s[2];
	return rc;
}